

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::clear(sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
        *this)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if (this->num_deleted != 0 || (this->table).settings.num_buckets != 0) {
    sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::clear
              (&this->table);
  }
  fVar2 = (float)(this->table).settings.table_size;
  fVar3 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_factor_ * fVar2;
  uVar1 = (ulong)fVar3;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar3 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  fVar2 = fVar2 * (this->settings).
                  super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.shrink_factor_;
  uVar1 = (ulong)fVar2;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  return;
}

Assistant:

void clear() {
    if (!empty() || (num_deleted != 0)) {
      table.clear();
    }
    settings.reset_thresholds(bucket_count());
    num_deleted = 0;
  }